

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

bool cmCTestSVNPathStarts(string *p1,string *p2)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *__s2;
  size_t __n;
  string *p2_local;
  string *p1_local;
  
  lVar2 = std::__cxx11::string::size();
  lVar3 = std::__cxx11::string::size();
  if (lVar2 == lVar3) {
    p1_local._7_1_ = std::operator==(p1,p2);
  }
  else {
    uVar4 = std::__cxx11::string::size();
    uVar5 = std::__cxx11::string::size();
    if (uVar5 < uVar4) {
      std::__cxx11::string::size();
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)p1);
      if (*pcVar6 == '/') {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        __s2 = (char *)std::__cxx11::string::c_str();
        __n = std::__cxx11::string::size();
        iVar1 = strncmp(pcVar6,__s2,__n);
        return iVar1 == 0;
      }
    }
    p1_local._7_1_ = false;
  }
  return p1_local._7_1_;
}

Assistant:

static bool cmCTestSVNPathStarts(std::string const& p1, std::string const& p2)
{
  // Does path p1 start with path p2?
  if(p1.size() == p2.size())
    {
    return p1 == p2;
    }
  else if(p1.size() > p2.size() && p1[p2.size()] == '/')
    {
    return strncmp(p1.c_str(), p2.c_str(), p2.size()) == 0;
    }
  else
    {
    return false;
    }
}